

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::FluxRegister::FineSetVal
          (FluxRegister *this,int dir,int boxno,int destcomp,int numcomp,Real val,RunOn runon)

{
  BaseFab<double> *pBVar1;
  Real local_38;
  
  local_38 = val;
  pBVar1 = &FabArray<amrex::FArrayBox>::fabPtr
                      ((FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + dir),boxno
                      )->super_BaseFab<double>;
  BaseFab<double>::setVal<(amrex::RunOn)1>
            (pBVar1,&local_38,&pBVar1->domain,(DestComp)destcomp,(NumComps)numcomp);
  pBVar1 = &FabArray<amrex::FArrayBox>::fabPtr
                      ((FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + (dir + 3))
                       ,boxno)->super_BaseFab<double>;
  BaseFab<double>::setVal<(amrex::RunOn)1>
            (pBVar1,&local_38,&pBVar1->domain,(DestComp)destcomp,(NumComps)numcomp);
  return;
}

Assistant:

void
FluxRegister::FineSetVal (int              dir,
                          int              boxno,
                          int              destcomp,
                          int              numcomp,
                          Real             val,
                          RunOn            runon) noexcept
{
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    FArrayBox& loreg = bndry[Orientation(dir,Orientation::low)][boxno];
    BL_ASSERT(numcomp <= loreg.nComp());
    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion()) {
        loreg.setVal<RunOn::Device>(val, loreg.box(), destcomp, numcomp);
    } else {
        loreg.setVal<RunOn::Host>(val, loreg.box(), destcomp, numcomp);
    }

    FArrayBox& hireg = bndry[Orientation(dir,Orientation::high)][boxno];
    BL_ASSERT(numcomp <= hireg.nComp());
    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion()) {
        hireg.setVal<RunOn::Device>(val, hireg.box(), destcomp, numcomp);
    } else {
        hireg.setVal<RunOn::Host>(val, hireg.box(), destcomp, numcomp);
    }
}